

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void I422ToARGB4444Row_C(uint8_t *src_y,uint8_t *src_u,uint8_t *src_v,uint8_t *dst_argb4444,
                        YuvConstants *yuvconstants,int width)

{
  uint8_t u;
  uint8_t v;
  uint uVar1;
  undefined4 in_register_0000008c;
  int iVar2;
  long lVar3;
  uint8_t r1;
  uint8_t g1;
  uint8_t b1;
  byte local_5a;
  byte local_59;
  byte local_58;
  byte local_57;
  byte local_56;
  byte local_55;
  int local_54;
  uint8_t *local_50;
  uint8_t *local_48;
  uint8_t *local_40;
  ulong local_38;
  
  local_38 = CONCAT44(in_register_0000008c,width);
  local_54 = width + -1;
  lVar3 = 0;
  local_50 = src_u;
  local_48 = src_v;
  local_40 = dst_argb4444;
  for (iVar2 = 0; iVar2 < local_54; iVar2 = iVar2 + 2) {
    u = local_50[lVar3];
    v = local_48[lVar3];
    libyuv::YuvPixel(src_y[lVar3 * 2],u,v,&local_58,&local_59,&local_5a,yuvconstants);
    libyuv::YuvPixel(src_y[lVar3 * 2 + 1],u,v,&local_55,&local_56,&local_57,yuvconstants);
    local_58 = local_58 >> 4;
    uVar1 = (uint)local_59;
    local_59 = local_59 >> 4;
    local_5a = local_5a >> 4;
    local_55 = local_55 >> 4;
    local_56 = local_56 >> 4;
    local_57 = local_57 >> 4;
    *(uint *)(local_40 + lVar3 * 4) =
         (uint)local_57 << 0x18 |
         (uint)local_56 << 0x14 |
         (uint)local_55 << 0x10 | (uint)local_5a << 8 | uVar1 & 0xfffffff0 | (uint)local_58 |
         0xf000f000;
    lVar3 = lVar3 + 1;
  }
  if ((local_38 & 1) != 0) {
    libyuv::YuvPixel(src_y[lVar3 * 2],local_50[lVar3],local_48[lVar3],&local_58,&local_59,&local_5a,
                     yuvconstants);
    *(ushort *)(local_40 + lVar3 * 4) =
         (local_5a & 0xf0) * 0x10 + (local_59 & 0xfff0 | (ushort)(local_58 >> 4)) + -0x1000;
  }
  return;
}

Assistant:

void I422ToARGB4444Row_C(const uint8_t* src_y,
                         const uint8_t* src_u,
                         const uint8_t* src_v,
                         uint8_t* dst_argb4444,
                         const struct YuvConstants* yuvconstants,
                         int width) {
  uint8_t b0;
  uint8_t g0;
  uint8_t r0;
  uint8_t b1;
  uint8_t g1;
  uint8_t r1;
  int x;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel(src_y[0], src_u[0], src_v[0], &b0, &g0, &r0, yuvconstants);
    YuvPixel(src_y[1], src_u[0], src_v[0], &b1, &g1, &r1, yuvconstants);
    b0 = b0 >> 4;
    g0 = g0 >> 4;
    r0 = r0 >> 4;
    b1 = b1 >> 4;
    g1 = g1 >> 4;
    r1 = r1 >> 4;
    *(uint32_t*)(dst_argb4444) = b0 | (g0 << 4) | (r0 << 8) | (b1 << 16) |
                                 (g1 << 20) | (r1 << 24) | 0xf000f000;
    src_y += 2;
    src_u += 1;
    src_v += 1;
    dst_argb4444 += 4;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel(src_y[0], src_u[0], src_v[0], &b0, &g0, &r0, yuvconstants);
    b0 = b0 >> 4;
    g0 = g0 >> 4;
    r0 = r0 >> 4;
    *(uint16_t*)(dst_argb4444) = b0 | (g0 << 4) | (r0 << 8) | 0xf000;
  }
}